

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.cpp
# Opt level: O0

double __thiscall entropy::calcEntropy(entropy *this)

{
  int iVar1;
  reference this_00;
  reference this_01;
  reference this_02;
  reference pvVar2;
  vector<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  *in_RDI;
  __type _Var3;
  int l;
  int k;
  int j;
  int i;
  double res;
  int ns;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  double local_18;
  
  iVar1 = *(int *)((long)&in_RDI[1].
                          super__Vector_base<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  _Var3 = std::log<int>(0);
  local_18 = (double)iVar1 * _Var3;
  for (local_1c = 0;
      local_1c <
      *(int *)((long)&in_RDI[1].
                      super__Vector_base<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 4); local_1c = local_1c + 1) {
    for (local_20 = 0;
        local_20 <
        *(int *)((long)&in_RDI[1].
                        super__Vector_base<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4); local_20 = local_20 + 1) {
      for (local_24 = 0;
          local_24 <
          *(int *)((long)&in_RDI[1].
                          super__Vector_base<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4); local_24 = local_24 + 1) {
        for (local_28 = 0;
            local_28 <
            *(int *)((long)&in_RDI[1].
                            super__Vector_base<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4); local_28 = local_28 + 1)
        {
          this_00 = std::
                    vector<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                    ::operator[](in_RDI,(long)local_1c);
          this_01 = std::
                    vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                    ::operator[](this_00,(long)local_20);
          this_02 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](this_01,(long)local_24);
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)local_28);
          iVar1 = *pvVar2;
          if (0 < iVar1) {
            _Var3 = std::log<int>(0);
            local_18 = -(double)iVar1 * _Var3 + local_18;
          }
        }
      }
    }
  }
  return local_18;
}

Assistant:

double entropy::calcEntropy()
{
    //int n = particles.size();
    int ns = 0;
    double res = n * log(n);
    for (int i = 0; i < position_box_count; i++)
    {
        for (int j = 0; j < position_box_count; j++)
        {
            for (int k = 0; k < velocity_box_count; k++)
            {
                for (int l = 0; l < velocity_box_count; l++)
                {
                    ns = boxes[i][j][k][l];
                    if (ns > 0)
                    {
                        res -= ns * log(ns);
                    }
                }
            }
        }
    }
    return res;
}